

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O0

bool __thiscall CStorage::FindFileImpl(CStorage *this,int Type,CFindCBData *pCBData)

{
  long lVar1;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  char aBuf [512];
  char *in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  int iVar2;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 uVar3;
  long lVar4;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  bool bVar5;
  char *in_stack_fffffffffffffdf8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RDX + 0x20) < 1) {
    bVar5 = false;
  }
  else {
    **(undefined1 **)(in_RDX + 0x18) = 0;
    if (in_ESI == -1) {
      uVar3 = 0xffffffff;
      lVar4 = in_RDI;
      for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 0x2010); iVar2 = iVar2 + 1) {
        GetPath((CStorage *)CONCAT44(iVar2,in_stack_fffffffffffffdd0),(int)((ulong)in_RDI >> 0x20),
                (char *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                in_stack_fffffffffffffdb8,0);
        fs_listdir(in_stack_fffffffffffffdf8,
                   (FS_LISTDIR_CALLBACK)
                   CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                   (int)((ulong)lVar4 >> 0x20),(void *)CONCAT44(uVar3,in_stack_fffffffffffffde0));
        if (**(char **)(in_RDX + 0x18) != '\0') {
          bVar5 = true;
          goto LAB_0024f221;
        }
      }
    }
    else if ((-1 < in_ESI) && (in_ESI < *(int *)(in_RDI + 0x2010))) {
      GetPath((CStorage *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
              (int)((ulong)in_RDI >> 0x20),
              (char *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
              in_stack_fffffffffffffdb8,0);
      fs_listdir(in_stack_fffffffffffffdf8,
                 (FS_LISTDIR_CALLBACK)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                 (int)((ulong)in_RDI >> 0x20),(void *)CONCAT44(in_ESI,in_stack_fffffffffffffde0));
    }
    bVar5 = **(char **)(in_RDX + 0x18) != '\0';
  }
LAB_0024f221:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool FindFileImpl(int Type, CFindCBData *pCBData)
	{
		if(pCBData->m_BufferSize < 1)
			return false;

		pCBData->m_pBuffer[0] = 0;

		char aBuf[IO_MAX_PATH_LENGTH];

		if(Type == TYPE_ALL)
		{
			// search within all available directories
			for(int i = 0; i < m_NumPaths; ++i)
			{
				fs_listdir(GetPath(i, pCBData->m_pPath, aBuf, sizeof(aBuf)), FindFileCallback, i, pCBData);
				if(pCBData->m_pBuffer[0])
					return true;
			}
		}
		else if(Type >= 0 && Type < m_NumPaths)
		{
			// search within wanted directory
			fs_listdir(GetPath(Type, pCBData->m_pPath, aBuf, sizeof(aBuf)), FindFileCallback, Type, pCBData);
		}

		return pCBData->m_pBuffer[0] != 0;
	}